

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall xLearn::MODEL_TEST_BestModel_Test::TestBody(MODEL_TEST_BestModel_Test *this)

{
  undefined8 uVar1;
  real_t *prVar2;
  real_t *prVar3;
  real_t *prVar4;
  index_t i;
  ulong uVar5;
  index_t i_4;
  char *pcVar6;
  undefined1 auVar7 [16];
  AssertHelper local_2f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  AssertionResult gtest_ar;
  Model model_ffm;
  HyperParam hyper_param;
  
  Init();
  model_ffm.score_func_._M_dataplus._M_p = (pointer)&model_ffm.score_func_.field_2;
  model_ffm.loss_func_._M_dataplus._M_p = (pointer)&model_ffm.loss_func_.field_2;
  model_ffm.score_func_._M_string_length = 0;
  model_ffm.score_func_.field_2._M_local_buf[0] = '\0';
  model_ffm.loss_func_._M_string_length = 0;
  model_ffm.loss_func_.field_2._M_local_buf[0] = '\0';
  model_ffm.param_w_ = (real_t *)0x0;
  model_ffm.param_v_ = (real_t *)0x0;
  model_ffm.param_b_ = (real_t *)0x0;
  model_ffm.param_best_w_ = (real_t *)0x0;
  model_ffm.param_best_v_ = (real_t *)0x0;
  model_ffm.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&model_ffm,&hyper_param.score_func,&hyper_param.loss_func,
                    hyper_param.num_feature,hyper_param.num_field,hyper_param.num_K,2,1.0);
  prVar4 = model_ffm.param_b_;
  prVar3 = model_ffm.param_v_;
  prVar2 = model_ffm.param_w_;
  for (uVar5 = 0; uVar5 < model_ffm.param_num_w_; uVar5 = uVar5 + 1) {
    model_ffm.param_w_[uVar5] = 1.0;
  }
  for (uVar5 = 0; model_ffm.param_num_v_ != uVar5; uVar5 = uVar5 + 1) {
    model_ffm.param_v_[uVar5] = 2.0;
  }
  auVar7._8_4_ = 0x40400000;
  auVar7._0_8_ = 0x4040000040400000;
  auVar7._12_4_ = 0x40400000;
  uVar1 = vmovlps_avx(auVar7);
  *(undefined8 *)model_ffm.param_b_ = uVar1;
  Model::SetBestModel(&model_ffm);
  for (uVar5 = 0; model_ffm.param_num_w_ != uVar5; uVar5 = uVar5 + 1) {
    prVar2[uVar5] = 0.0;
  }
  for (uVar5 = 0; model_ffm.param_num_v_ != uVar5; uVar5 = uVar5 + 1) {
    prVar3[uVar5] = 0.0;
  }
  prVar4[0] = 0.0;
  prVar4[1] = 0.0;
  Model::Shrink(&model_ffm);
  for (uVar5 = 0; uVar5 < model_ffm.param_num_w_; uVar5 = uVar5 + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"w[i]","1",prVar2[uVar5],1.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_2f0);
      pcVar6 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x10f,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_2f0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  for (uVar5 = 0; uVar5 < model_ffm.param_num_v_; uVar5 = uVar5 + 1) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"v[i]","2",prVar3[uVar5],2.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_2f0);
      pcVar6 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x112,pcVar6);
      testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_2f0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  testing::internal::CmpHelperFloatingPointEQ<float>((internal *)&gtest_ar,"b[0]","3",*prVar4,3.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x114,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>((internal *)&gtest_ar,"b[1]","3",prVar4[1],3.0)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_2f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x115,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_2f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Model::~Model(&model_ffm);
  HyperParam::~HyperParam(&hyper_param);
  return;
}

Assistant:

TEST(MODEL_TEST, BestModel) {
  // Init model
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K, 2);
  real_t* w = model_ffm.GetParameter_w();
  real_t* v = model_ffm.GetParameter_v();
  real_t* b = model_ffm.GetParameter_b();
  // Set best model
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 1;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 2;
  }
  b[0] = 3;
  b[1] = 3;
  model_ffm.SetBestModel();
  // Shrink bacj
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    w[i] = 0;
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    v[i] = 0;
  }
  b[0] = 0;
  b[1] = 0;
  model_ffm.Shrink();
  // Test
  for (index_t i = 0; i < model_ffm.GetNumParameter_w(); ++i) {
    EXPECT_FLOAT_EQ(w[i], 1);
  }
  for (index_t i = 0; i < model_ffm.GetNumParameter_v(); ++i) {
    EXPECT_FLOAT_EQ(v[i], 2);
  }
  EXPECT_FLOAT_EQ(b[0], 3);
  EXPECT_FLOAT_EQ(b[1], 3);
}